

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OMFormatT.cc
# Opt level: O0

size_t OpenMesh::IO::store<int>(int *_os,int *_val,int32 _b,byte _swap)

{
  bool bVar1;
  long local_40;
  int64 v_3;
  short local_30;
  char local_2e;
  byte local_2d;
  int32 v_2;
  int16 v_1;
  int8 v;
  bool _swap_local;
  Integer_Size _b_local;
  int *_val_local;
  ostream *_os_local;
  size_t local_10;
  
  local_2d = _swap & 1;
  v_2 = _b;
  _v_1 = _val;
  _val_local = _os;
  bVar1 = OMFormat::is_integer<int>(*_val);
  if (bVar1) {
    switch(v_2) {
    case 0:
      local_2e = (char)*_v_1;
      local_10 = store<char>((ostream *)_val_local,&local_2e,(bool)(local_2d & 1));
      break;
    case 1:
      local_30 = (short)*_v_1;
      local_10 = store<short>((ostream *)_val_local,&local_30,(bool)(local_2d & 1));
      break;
    case 2:
      v_3._4_4_ = *_v_1;
      local_10 = store<int>((ostream *)_val_local,(int *)((long)&v_3 + 4),(bool)(local_2d & 1));
      break;
    case 3:
      local_40 = (long)*_v_1;
      local_10 = store<long_long>((ostream *)_val_local,&local_40,(bool)(local_2d & 1));
      break;
    default:
      local_10 = 0;
    }
    return local_10;
  }
  __assert_fail("OMFormat::is_integer( _val )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./OpenMesh/Core/IO/OMFormatT.cc"
                ,0x49,
                "size_t OpenMesh::IO::store(std::ostream &, const T &, OMFormat::Chunk::Integer_Size, bool, t_signed) [T = int]"
               );
}

Assistant:

size_t 
  store( std::ostream& _os, 
	 const T& _val, 
	 OMFormat::Chunk::Integer_Size _b, 
	 bool _swap,
	 t_signed)
  {    
    assert( OMFormat::is_integer( _val ) );

    switch( _b ) 
    {
      case OMFormat::Chunk::Integer_8:
      { 	
	OMFormat::int8 v = static_cast<OMFormat::int8>(_val);
	return store( _os, v, _swap );
      }
      case OMFormat::Chunk::Integer_16:
      { 
	OMFormat::int16 v = static_cast<OMFormat::int16>(_val);
	return store( _os, v, _swap );
      }
      case OMFormat::Chunk::Integer_32:
      { 
	OMFormat::int32 v = static_cast<OMFormat::int32>(_val);
	return store( _os, v, _swap );
      }      
      case OMFormat::Chunk::Integer_64:
      { 
	OMFormat::int64 v = static_cast<OMFormat::int64>(_val);
	return store( _os, v, _swap );
      }
    }
    return 0;
  }